

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_clean_whitespaces(char *str_in)

{
  bool bVar1;
  int found_whitespace;
  char *write;
  char *read;
  char *str_in_local;
  
  for (read = str_in; write = str_in, *read == ' '; read = read + 1) {
  }
  while( true ) {
    bVar1 = false;
    for (; *read == ' '; read = read + 1) {
      bVar1 = true;
    }
    if (*read == '\0') break;
    if (bVar1) {
      *write = ' ';
      write = write + 1;
    }
    *write = *read;
    write = write + 1;
    read = read + 1;
  }
  *write = '\0';
  return;
}

Assistant:

void str_clean_whitespaces(char *str_in)
{
	char *read = str_in;
	char *write = str_in;

	/* skip initial whitespace */
	while(*read == ' ')
		read++;

	/* end of read string is detected in the loop */
	while(1)
	{
		/* skip whitespace */
		int found_whitespace = 0;
		for(; *read == ' '; read++)
			found_whitespace = 1;
		/* if not at the end of the string, put a found whitespace here */
		if(*read)
		{
			if(found_whitespace)
				*write++ = ' ';
			*write++ = *read++;
		}
		else
		{
			*write = 0;
			break;
		}
	}
}